

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O2

int64_t duckdb::DateSub::MillisecondsOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                  (date_t startdate,date_t enddate)

{
  timestamp_t startdate_00;
  timestamp_t enddate_00;
  long lVar1;
  
  startdate_00.value = duckdb::Timestamp::FromDatetime(startdate,(dtime_t)0x0);
  enddate_00.value = duckdb::Timestamp::FromDatetime(enddate,(dtime_t)0x0);
  lVar1 = Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>(startdate_00,enddate_00);
  return lVar1;
}

Assistant:

int64_t DateSub::MillisecondsOperator::Operation(date_t startdate, date_t enddate) {
	dtime_t t0(0);
	return MillisecondsOperator::Operation<timestamp_t, timestamp_t, int64_t>(Timestamp::FromDatetime(startdate, t0),
	                                                                          Timestamp::FromDatetime(enddate, t0));
}